

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::VulkanSyncObjectManager
          (VulkanSyncObjectManager *this,VulkanLogicalDevice *LogicalDevice)

{
  VulkanLogicalDevice *LogicalDevice_local;
  VulkanSyncObjectManager *this_local;
  
  std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::enable_shared_from_this
            (&this->super_enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>);
  this->m_LogicalDevice = LogicalDevice;
  std::mutex::mutex(&this->m_SemaphorePoolGuard);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::vector(&this->m_SemaphorePool);
  std::mutex::mutex(&this->m_FencePoolGuard);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::vector(&this->m_FencePool);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::reserve
            (&this->m_SemaphorePool,0x40);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::reserve(&this->m_FencePool,0x20);
  return;
}

Assistant:

VulkanSyncObjectManager::VulkanSyncObjectManager(VulkanLogicalDevice& LogicalDevice) :
    m_LogicalDevice{LogicalDevice}
{
    m_SemaphorePool.reserve(64);
    m_FencePool.reserve(32);
}